

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetPchCreateCompileOptions
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language,
          string *arch)

{
  cmAlphaNum *this_00;
  cmMakefile *this_01;
  bool bVar1;
  pointer ppVar2;
  ulong uVar3;
  string *psVar4;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  _Var5;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  undefined1 local_400 [8];
  string pchFile;
  string pchHeader;
  cmAlphaNum local_390;
  string local_360;
  cmAlphaNum local_340;
  cmAlphaNum local_310;
  undefined1 local_2e0 [8];
  string createOptVar;
  cmAlphaNum local_290;
  string local_260;
  undefined1 local_240 [8];
  string instantiateOption;
  cmAlphaNum local_1f0;
  undefined1 local_1c0 [8];
  string varName;
  string local_198;
  cmAlphaNum local_178;
  cmAlphaNum local_148;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  string *local_d0;
  string *createOptionList;
  undefined1 local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  local_68;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_const_char_*>_>::value,_pair<iterator,_bool>_>
  inserted;
  string *arch_local;
  string *language_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  inserted._8_8_ = arch;
  std::operator+(&local_a8,language,config);
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)inserted._8_8_
                );
  std::make_pair<std::__cxx11::string,char_const(&)[1]>(&local_68,&local_88,(char (*) [1])0xc7f107);
  _Var5 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::insert<std::pair<std::__cxx11::string,char_const*>>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)&this->PchCreateCompileOptions,&local_68);
  createOptionList = (string *)_Var5.first._M_node;
  local_c0 = _Var5.second;
  local_40._M_node = (_Base_ptr)createOptionList;
  inserted.first._M_node._0_1_ = local_c0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>
  ::~pair(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  if (((byte)inserted.first._M_node & 1) != 0) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_40);
    local_d0 = &ppVar2->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"PCH_WARN_INVALID",&local_f1);
    bVar1 = GetPropertyAsBool(this,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    if (bVar1) {
      this_01 = this->Makefile;
      cmAlphaNum::cmAlphaNum(&local_148,"CMAKE_");
      cmAlphaNum::cmAlphaNum(&local_178,language);
      cmStrCat<char[29]>(&local_118,&local_148,&local_178,
                         (char (*) [29])"_COMPILE_OPTIONS_INVALID_PCH");
      psVar4 = cmMakefile::GetSafeDefinition(this_01,&local_118);
      std::__cxx11::string::operator=((string *)local_d0,(string *)psVar4);
      std::__cxx11::string::~string((string *)&local_118);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_198,"PCH_INSTANTIATE_TEMPLATES",
               (allocator<char> *)(varName.field_2._M_local_buf + 0xf));
    bVar1 = GetPropertyAsBool(this,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)(varName.field_2._M_local_buf + 0xf));
    if (bVar1) {
      cmAlphaNum::cmAlphaNum(&local_1f0,"CMAKE_");
      this_00 = (cmAlphaNum *)((long)&instantiateOption.field_2 + 8);
      cmAlphaNum::cmAlphaNum(this_00,language);
      cmStrCat<char[43]>((string *)local_1c0,&local_1f0,this_00,
                         (char (*) [43])"_COMPILE_OPTIONS_INSTANTIATE_TEMPLATES_PCH");
      psVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_1c0);
      std::__cxx11::string::string((string *)local_240,(string *)psVar4);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        cmAlphaNum::cmAlphaNum(&local_290,local_d0);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&createOptVar.field_2 + 8),";");
        cmStrCat<std::__cxx11::string>
                  (&local_260,&local_290,(cmAlphaNum *)((long)&createOptVar.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
        std::__cxx11::string::operator=((string *)local_d0,(string *)&local_260);
        std::__cxx11::string::~string((string *)&local_260);
      }
      std::__cxx11::string::~string((string *)local_240);
      std::__cxx11::string::~string((string *)local_1c0);
    }
    cmAlphaNum::cmAlphaNum(&local_310,"CMAKE_");
    cmAlphaNum::cmAlphaNum(&local_340,language);
    cmStrCat<char[28]>((string *)local_2e0,&local_310,&local_340,
                       (char (*) [28])"_COMPILE_OPTIONS_CREATE_PCH");
    cmAlphaNum::cmAlphaNum(&local_390,local_d0);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&pchHeader.field_2 + 8),";");
    psVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_2e0);
    cmStrCat<std::__cxx11::string>
              (&local_360,&local_390,(cmAlphaNum *)((long)&pchHeader.field_2 + 8),psVar4);
    std::__cxx11::string::operator=((string *)local_d0,(string *)&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    GetPchHeader((string *)((long)&pchFile.field_2 + 8),this,config,language,
                 (string *)inserted._8_8_);
    GetPchFile((string *)local_400,this,config,language,(string *)inserted._8_8_);
    psVar4 = local_d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"<PCH_HEADER>",&local_421);
    cmsys::SystemTools::ReplaceString(psVar4,&local_420,(string *)((long)&pchFile.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator(&local_421);
    psVar4 = local_d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"<PCH_FILE>",&local_449)
    ;
    cmsys::SystemTools::ReplaceString(psVar4,&local_448,(string *)local_400);
    std::__cxx11::string::~string((string *)&local_448);
    std::allocator<char>::~allocator(&local_449);
    std::__cxx11::string::~string((string *)local_400);
    std::__cxx11::string::~string((string *)(pchFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_2e0);
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_40);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPchCreateCompileOptions(
  const std::string& config, const std::string& language,
  const std::string& arch)
{
  const auto inserted = this->PchCreateCompileOptions.insert(
    std::make_pair(language + config + arch, ""));
  if (inserted.second) {
    std::string& createOptionList = inserted.first->second;

    if (this->GetPropertyAsBool("PCH_WARN_INVALID")) {
      createOptionList = this->Makefile->GetSafeDefinition(
        cmStrCat("CMAKE_", language, "_COMPILE_OPTIONS_INVALID_PCH"));
    }

    if (this->GetPropertyAsBool("PCH_INSTANTIATE_TEMPLATES")) {
      std::string varName = cmStrCat(
        "CMAKE_", language, "_COMPILE_OPTIONS_INSTANTIATE_TEMPLATES_PCH");
      std::string instantiateOption =
        this->Makefile->GetSafeDefinition(varName);
      if (!instantiateOption.empty()) {
        createOptionList = cmStrCat(createOptionList, ";", instantiateOption);
      }
    }

    const std::string createOptVar =
      cmStrCat("CMAKE_", language, "_COMPILE_OPTIONS_CREATE_PCH");

    createOptionList = cmStrCat(
      createOptionList, ";", this->Makefile->GetSafeDefinition(createOptVar));

    const std::string pchHeader = this->GetPchHeader(config, language, arch);
    const std::string pchFile = this->GetPchFile(config, language, arch);

    cmSystemTools::ReplaceString(createOptionList, "<PCH_HEADER>", pchHeader);
    cmSystemTools::ReplaceString(createOptionList, "<PCH_FILE>", pchFile);
  }
  return inserted.first->second;
}